

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall BotscriptParser::parseBreak(BotscriptParser *this)

{
  List<ScopeInfo> *this_00;
  ScopeType SVar1;
  DataBuffer *pDVar2;
  ScopeInfo *pSVar3;
  ByteMark *mark;
  
  if (this->m_scopeCursor == 0) {
    error<>("unexpected `break`");
  }
  pDVar2 = currentBuffer(this);
  DataBuffer::writeHeader(pDVar2,Goto);
  this_00 = &this->m_scopeStack;
  pSVar3 = List<ScopeInfo>::operator[](this_00,this->m_scopeCursor);
  SVar1 = pSVar3->type;
  if (SVar1 - 2 < 2) {
    pDVar2 = currentBuffer(this);
    pSVar3 = List<ScopeInfo>::operator[](this_00,this->m_scopeCursor);
    mark = pSVar3->mark2;
  }
  else {
    if ((SVar1 != SCOPE_Switch) && (SVar1 != SCOPE_If)) {
      error<>("unexpected `break`");
      goto LAB_0012802f;
    }
    pDVar2 = currentBuffer(this);
    pSVar3 = List<ScopeInfo>::operator[](this_00,this->m_scopeCursor);
    mark = pSVar3->mark1;
  }
  DataBuffer::addReference(pDVar2,mark);
LAB_0012802f:
  Lexer::mustGetNext(this->m_lexer,Semicolon);
  return;
}

Assistant:

void BotscriptParser::parseBreak()
{
	if (m_scopeCursor == 0)
		error ("unexpected `break`");

	currentBuffer()->writeHeader (DataHeader::Goto);

	// switch and if use mark1 for the closing point,
	// for and while use mark2.
	switch (SCOPE (0).type)
	{
		case SCOPE_If:
		case SCOPE_Switch:
			currentBuffer()->addReference (SCOPE (0).mark1);
			break;

		case SCOPE_For:
		case SCOPE_While:
			currentBuffer()->addReference (SCOPE (0).mark2);
			break;

		default:
			error ("unexpected `break`");
			break;
	}

	m_lexer->mustGetNext (Token::Semicolon);
}